

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::DirectionalAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::DirectionalAtypeParameters> *this)

{
  SimpleTypeData<OpenMD::DirectionalAtypeParameters> *in_RDI;
  
  ~SimpleTypeData(in_RDI);
  operator_delete(in_RDI,0x70);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}